

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O0

int RqOutAddIds(RqOutWorkMem *pOutWorkMem,int32_t nOutSymIdBeg,int32_t nOutSymIdAdd)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  int ret;
  int local_18;
  int local_14;
  int local_10;
  
  local_14 = 0;
  local_10 = in_EDX;
  if (*(int *)(in_RDI + 0x2c) < *(int *)(in_RDI + 0x30) + in_EDX) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x10e,"Maximum number of ESIs reached.");
    local_10 = *(int *)(in_RDI + 0x2c) - *(int *)(in_RDI + 0x30);
    local_14 = -3;
  }
  for (local_18 = 0; local_18 < local_10; local_18 = local_18 + 1) {
    iVar1 = *(int *)(in_RDI + 0x30);
    *(int *)(in_RDI + 0x30) = iVar1 + 1;
    *(int *)(in_RDI + 0x34 + (long)iVar1 * 4) = in_ESI + local_18;
  }
  return local_14;
}

Assistant:

int RqOutAddIds(RqOutWorkMem* pOutWorkMem,
		int32_t nOutSymIdBeg,
		int32_t nOutSymIdAdd)
{
	int ret = 0;
	if (pOutWorkMem->nESI + nOutSymIdAdd > pOutWorkMem->nESI_max) {
		errmsg("Maximum number of ESIs reached.");

		nOutSymIdAdd = pOutWorkMem->nESI_max - pOutWorkMem->nESI;
		ret = RQ_ERR_MAX_IDS_REACHED;
	}

	for (int i = 0; i < nOutSymIdAdd; ++i) {
		pOutWorkMem->ESIs[pOutWorkMem->nESI++] = nOutSymIdBeg + i;
	}

	return ret;
}